

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

CompileMessage *
soul::CompileMessageHelpers::createMessage<>
          (CompileMessage *__return_storage_ptr__,Category category,CodeLocation *location,Type type
          ,char *text)

{
  ulong uVar1;
  size_type sVar2;
  reference value;
  string local_e8;
  string local_c8;
  string local_a8;
  ulong local_88;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  allocator<char> local_51;
  string local_50 [8];
  string result;
  char *text_local;
  Type type_local;
  CodeLocation *location_local;
  Category category_local;
  
  result.field_2._8_8_ = text;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,text,&local_51);
  std::allocator<char>::~allocator(&local_51);
  memset(&i,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  local_88 = 0;
  while( true ) {
    uVar1 = local_88;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i);
    if (sVar2 <= uVar1) break;
    std::__cxx11::string::string((string *)&local_c8,local_50);
    uVar1 = local_88;
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,local_88);
    replaceArgument(&local_a8,&local_c8,uVar1,value);
    std::__cxx11::string::operator=(local_50,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    local_88 = local_88 + 1;
  }
  std::__cxx11::string::string((string *)&local_e8,local_50);
  choc::text::trim(&__return_storage_ptr__->description,&local_e8);
  CodeLocation::CodeLocation(&__return_storage_ptr__->location,location);
  __return_storage_ptr__->type = type;
  __return_storage_ptr__->category = category;
  std::__cxx11::string::~string((string *)&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }